

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O1

int luaD_precall(lua_State *L,StkId func,int nresults)

{
  Instruction **ppIVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  lua_CFunction p_Var5;
  undefined8 uVar6;
  undefined4 uVar7;
  uint uVar8;
  int iVar9;
  TValue *pTVar10;
  StkId pTVar11;
  CallInfo *pCVar12;
  TValue *io1;
  StkId pTVar13;
  int *piVar14;
  uint uVar15;
  ulong uVar16;
  TValue *io1_1;
  
  while( true ) {
    uVar8 = func->tt_ & 0x3f;
    if (uVar8 == 6) {
      lVar4 = *(long *)((func->value_).f + 0x18);
      uVar16 = (long)L->top - (long)func;
      bVar2 = *(byte *)(lVar4 + 0xc);
      if ((long)L->stack_last - (long)L->top >> 4 <= (long)(ulong)bVar2) {
        pTVar11 = L->stack;
        if (0 < L->l_G->GCdebt) {
          luaC_step(L);
        }
        luaD_growstack(L,(uint)bVar2);
        func = (StkId)(((long)func - (long)pTVar11) + (long)L->stack);
      }
      bVar3 = *(byte *)(lVar4 + 10);
      uVar8 = (uint)bVar3;
      iVar9 = (int)(uVar16 >> 4);
      if (*(char *)(lVar4 + 0xb) == '\0') {
        if (iVar9 <= (int)uVar8) {
          pTVar11 = L->top;
          iVar9 = (uVar8 - iVar9) + 1;
          do {
            pTVar11->tt_ = 0;
            pTVar11 = pTVar11 + 1;
            iVar9 = iVar9 + -1;
          } while (iVar9 != 0);
          L->top = pTVar11;
        }
        pTVar11 = func + 1;
      }
      else {
        pTVar11 = L->top;
        uVar16 = 0;
        if ((1 < iVar9) && (bVar3 != 0)) {
          uVar15 = iVar9 - 2U;
          if (bVar3 - 1 <= iVar9 - 2U) {
            uVar15 = bVar3 - 1;
          }
          piVar14 = &pTVar11[-(long)(iVar9 + -1)].tt_;
          uVar16 = 0;
          do {
            pTVar13 = L->top;
            L->top = pTVar13 + 1;
            uVar6 = *(undefined8 *)piVar14;
            pTVar13->value_ = ((TValue *)(piVar14 + -2))->value_;
            *(undefined8 *)&pTVar13->tt_ = uVar6;
            *piVar14 = 0;
            uVar16 = uVar16 + 1;
            piVar14 = piVar14 + 4;
          } while (uVar15 + 1 != uVar16);
        }
        iVar9 = uVar8 - (uint)uVar16;
        if ((uint)uVar16 <= uVar8 && iVar9 != 0) {
          pTVar13 = L->top;
          do {
            pTVar13->tt_ = 0;
            pTVar13 = pTVar13 + 1;
            iVar9 = iVar9 + -1;
          } while (iVar9 != 0);
          L->top = pTVar13;
        }
      }
      pCVar12 = L->ci->next;
      if (pCVar12 == (CallInfo *)0x0) {
        pCVar12 = luaE_extendCI(L);
      }
      L->ci = pCVar12;
      pCVar12->nresults = (short)nresults;
      pCVar12->func = func;
      (pCVar12->u).l.base = pTVar11;
      pCVar12->top = pTVar11 + bVar2;
      L->top = pTVar11 + bVar2;
      lVar4 = *(long *)(lVar4 + 0x38);
      (pCVar12->u).c.old_errfunc = lVar4;
      pCVar12->callstatus = 2;
      if ((L->hookmask & 1) != 0) {
        (pCVar12->u).l.savedpc = (Instruction *)(lVar4 + 4);
        iVar9 = 0;
        if (((pCVar12->previous->callstatus & 2) != 0) &&
           ((*(uint *)((pCVar12->previous->u).c.old_errfunc + -4) & 0x3f) == 0x25)) {
          pCVar12->callstatus = 0x22;
          iVar9 = 4;
        }
        luaD_hook(L,iVar9,-1);
        ppIVar1 = &(pCVar12->u).l.savedpc;
        *ppIVar1 = *ppIVar1 + -1;
      }
      return 0;
    }
    pTVar11 = func;
    if (uVar8 == 0x16) break;
    if (uVar8 == 0x26) {
      pTVar11 = (StkId)((func->value_).f + 0x18);
      break;
    }
    if ((long)L->stack_last - (long)L->top < 0x11) {
      pTVar11 = L->stack;
      if (0 < L->l_G->GCdebt) {
        luaC_step(L);
      }
      luaD_growstack(L,1);
      func = (StkId)(((long)func - (long)pTVar11) + (long)L->stack);
    }
    pTVar10 = luaT_gettmbyobj(L,func,TM_CALL);
    if ((pTVar10->tt_ & 0xfU) != 6) {
      luaG_typeerror(L,func,"call");
    }
    for (pTVar11 = L->top; func < pTVar11; pTVar11 = pTVar11 + -1) {
      iVar9 = pTVar11[-1].tt_;
      uVar7 = *(undefined4 *)&pTVar11[-1].field_0xc;
      pTVar11->value_ = pTVar11[-1].value_;
      pTVar11->tt_ = iVar9;
      *(undefined4 *)&pTVar11->field_0xc = uVar7;
    }
    L->top = L->top + 1;
    iVar9 = pTVar10->tt_;
    uVar7 = *(undefined4 *)&pTVar10->field_0xc;
    func->value_ = pTVar10->value_;
    func->tt_ = iVar9;
    *(undefined4 *)&func->field_0xc = uVar7;
  }
  p_Var5 = (pTVar11->value_).f;
  if ((long)L->stack_last - (long)L->top < 0x150) {
    pTVar11 = L->stack;
    if (0 < L->l_G->GCdebt) {
      luaC_step(L);
    }
    luaD_growstack(L,0x14);
    func = (StkId)(((long)func - (long)pTVar11) + (long)L->stack);
  }
  pCVar12 = L->ci->next;
  if (pCVar12 == (CallInfo *)0x0) {
    pCVar12 = luaE_extendCI(L);
  }
  L->ci = pCVar12;
  pCVar12->nresults = (short)nresults;
  pCVar12->func = func;
  pCVar12->top = L->top + 0x14;
  pCVar12->callstatus = 0;
  if ((L->hookmask & 1) != 0) {
    luaD_hook(L,0,-1);
  }
  iVar9 = (*p_Var5)(L);
  luaD_poscall(L,pCVar12,L->top + -(long)iVar9,iVar9);
  return 1;
}

Assistant:

int luaD_precall (lua_State *L, StkId func, int nresults) {
  lua_CFunction f;
  CallInfo *ci;
  switch (ttype(func)) {
    case LUA_TCCL:  /* C closure */
      f = clCvalue(func)->f;
      goto Cfunc;
    case LUA_TLCF:  /* light C function */
      f = fvalue(func);
     Cfunc: {
      int n;  /* number of returns */
      checkstackp(L, LUA_MINSTACK, func);  /* ensure minimum stack size */
      ci = next_ci(L);  /* now 'enter' new function */
      ci->nresults = nresults;
      ci->func = func;
      ci->top = L->top + LUA_MINSTACK;
      lua_assert(ci->top <= L->stack_last);
      ci->callstatus = 0;
      if (L->hookmask & LUA_MASKCALL)
        luaD_hook(L, LUA_HOOKCALL, -1);
      lua_unlock(L);
      n = (*f)(L);  /* do the actual call */
      lua_lock(L);
      api_checknelems(L, n);
      luaD_poscall(L, ci, L->top - n, n);
      return 1;
    }
    case LUA_TLCL: {  /* Lua function: prepare its call */
      StkId base;
      Proto *p = clLvalue(func)->p;
      int n = cast_int(L->top - func) - 1;  /* number of real arguments */
      int fsize = p->maxstacksize;  /* frame size */
      checkstackp(L, fsize, func);
      if (p->is_vararg)
        base = adjust_varargs(L, p, n);
      else {  /* non vararg function */
        for (; n < p->numparams; n++)
          setnilvalue(L->top++);  /* complete missing arguments */
        base = func + 1;
      }
      ci = next_ci(L);  /* now 'enter' new function */
      ci->nresults = nresults;
      ci->func = func;
      ci->u.l.base = base;
      L->top = ci->top = base + fsize;
      lua_assert(ci->top <= L->stack_last);
      ci->u.l.savedpc = p->code;  /* starting point */
      ci->callstatus = CIST_LUA;
      if (L->hookmask & LUA_MASKCALL)
        callhook(L, ci);
      return 0;
    }
    default: {  /* not a function */
      checkstackp(L, 1, func);  /* ensure space for metamethod */
      tryfuncTM(L, func);  /* try to get '__call' metamethod */
      return luaD_precall(L, func, nresults);  /* now it must be a function */
    }
  }
}